

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O0

int ogg_stream_flush_i(ogg_stream_state *os,ogg_page *og,int force,int nfill)

{
  uint uVar1;
  int iVar2;
  int local_68;
  long local_60;
  long pageno;
  long serialno;
  int packet_just_done;
  int packets_done;
  ogg_int64_t granule_pos;
  long acc;
  int bytes;
  int maxvals;
  int vals;
  int i;
  int nfill_local;
  int force_local;
  ogg_page *og_local;
  ogg_stream_state *os_local;
  
  if (os->lacing_fill < 0x100) {
    local_68 = (int)os->lacing_fill;
  }
  else {
    local_68 = 0xff;
  }
  acc._0_4_ = 0;
  granule_pos = 0;
  _packet_just_done = -1;
  iVar2 = ogg_stream_check(os);
  if (iVar2 == 0) {
    if (local_68 == 0) {
      os_local._4_4_ = 0;
    }
    else {
      i = force;
      if (os->b_o_s == 0) {
        _packet_just_done = 0;
        for (bytes = 0; bytes < local_68; bytes = bytes + 1) {
          if ((os->lacing_vals[bytes] & 0xffU) < 0xff) {
            bytes = bytes + 1;
            break;
          }
        }
      }
      else {
        serialno._4_4_ = 0;
        serialno._0_4_ = 0;
        for (bytes = 0; bytes < local_68; bytes = bytes + 1) {
          if ((nfill < granule_pos) && (3 < (int)serialno)) {
            i = 1;
            break;
          }
          granule_pos = (int)(os->lacing_vals[bytes] & 0xff) + granule_pos;
          if ((os->lacing_vals[bytes] & 0xffU) < 0xff) {
            _packet_just_done = os->granule_vals[bytes];
            serialno._0_4_ = serialno._4_4_ + 1;
            serialno._4_4_ = (int)serialno;
          }
          else {
            serialno._0_4_ = 0;
          }
        }
        if (bytes == 0xff) {
          i = 1;
        }
      }
      if (i == 0) {
        os_local._4_4_ = 0;
      }
      else {
        builtin_memcpy(os->header,"OggS",5);
        os->header[5] = '\0';
        if ((*os->lacing_vals & 0x100U) == 0) {
          os->header[5] = os->header[5] | 1;
        }
        if (os->b_o_s == 0) {
          os->header[5] = os->header[5] | 2;
        }
        if ((os->e_o_s != 0) && (os->lacing_fill == (long)bytes)) {
          os->header[5] = os->header[5] | 4;
        }
        os->b_o_s = 1;
        for (maxvals = 6; maxvals < 0xe; maxvals = maxvals + 1) {
          os->header[maxvals] = (uchar)_packet_just_done;
          _packet_just_done = _packet_just_done >> 8;
        }
        pageno = os->serialno;
        for (maxvals = 0xe; maxvals < 0x12; maxvals = maxvals + 1) {
          os->header[maxvals] = (uchar)pageno;
          pageno = pageno >> 8;
        }
        if (os->pageno == -1) {
          os->pageno = 0;
        }
        local_60 = os->pageno;
        os->pageno = local_60 + 1;
        for (maxvals = 0x12; maxvals < 0x16; maxvals = maxvals + 1) {
          os->header[maxvals] = (uchar)local_60;
          local_60 = local_60 >> 8;
        }
        os->header[0x16] = '\0';
        os->header[0x17] = '\0';
        os->header[0x18] = '\0';
        os->header[0x19] = '\0';
        os->header[0x1a] = (uchar)bytes;
        for (maxvals = 0; maxvals < bytes; maxvals = maxvals + 1) {
          uVar1 = os->lacing_vals[maxvals];
          os->header[maxvals + 0x1b] = (uchar)uVar1;
          acc._0_4_ = (uVar1 & 0xff) + (int)acc;
        }
        og->header = os->header;
        os->header_fill = bytes + 0x1b;
        og->header_len = (long)(bytes + 0x1b);
        og->body = os->body_data + os->body_returned;
        og->body_len = (long)(int)acc;
        os->lacing_fill = os->lacing_fill - (long)bytes;
        memmove(os->lacing_vals,os->lacing_vals + bytes,os->lacing_fill << 2);
        memmove(os->granule_vals,os->granule_vals + bytes,os->lacing_fill << 3);
        os->body_returned = (long)(int)acc + os->body_returned;
        ogg_page_checksum_set(og);
        os_local._4_4_ = 1;
      }
    }
  }
  else {
    os_local._4_4_ = 0;
  }
  return os_local._4_4_;
}

Assistant:

static int ogg_stream_flush_i(ogg_stream_state *os,ogg_page *og, int force, int nfill){
  int i;
  int vals=0;
  int maxvals=(os->lacing_fill>255?255:os->lacing_fill);
  int bytes=0;
  long acc=0;
  ogg_int64_t granule_pos=-1;

  if(ogg_stream_check(os)) return(0);
  if(maxvals==0) return(0);

  /* construct a page */
  /* decide how many segments to include */

  /* If this is the initial header case, the first page must only include
     the initial header packet */
  if(os->b_o_s==0){  /* 'initial header page' case */
    granule_pos=0;
    for(vals=0;vals<maxvals;vals++){
      if((os->lacing_vals[vals]&0x0ff)<255){
        vals++;
        break;
      }
    }
  }else{

    /* The extra packets_done, packet_just_done logic here attempts to do two things:
       1) Don't unnecessarily span pages.
       2) Unless necessary, don't flush pages if there are less than four packets on
          them; this expands page size to reduce unnecessary overhead if incoming packets
          are large.
       These are not necessary behaviors, just 'always better than naive flushing'
       without requiring an application to explicitly request a specific optimized
       behavior. We'll want an explicit behavior setup pathway eventually as well. */

    int packets_done=0;
    int packet_just_done=0;
    for(vals=0;vals<maxvals;vals++){
      if(acc>nfill && packet_just_done>=4){
        force=1;
        break;
      }
      acc+=os->lacing_vals[vals]&0x0ff;
      if((os->lacing_vals[vals]&0xff)<255){
        granule_pos=os->granule_vals[vals];
        packet_just_done=++packets_done;
      }else
        packet_just_done=0;
    }
    if(vals==255)force=1;
  }

  if(!force) return(0);

  /* construct the header in temp storage */
  memcpy(os->header,"OggS",4);

  /* stream structure version */
  os->header[4]=0x00;

  /* continued packet flag? */
  os->header[5]=0x00;
  if((os->lacing_vals[0]&0x100)==0)os->header[5]|=0x01;
  /* first page flag? */
  if(os->b_o_s==0)os->header[5]|=0x02;
  /* last page flag? */
  if(os->e_o_s && os->lacing_fill==vals)os->header[5]|=0x04;
  os->b_o_s=1;

  /* 64 bits of PCM position */
  for(i=6;i<14;i++){
    os->header[i]=(unsigned char)(granule_pos&0xff);
    granule_pos>>=8;
  }

  /* 32 bits of stream serial number */
  {
    long serialno=os->serialno;
    for(i=14;i<18;i++){
      os->header[i]=(unsigned char)(serialno&0xff);
      serialno>>=8;
    }
  }

  /* 32 bits of page counter (we have both counter and page header
     because this val can roll over) */
  if(os->pageno==-1)os->pageno=0; /* because someone called
                                     stream_reset; this would be a
                                     strange thing to do in an
                                     encode stream, but it has
                                     plausible uses */
  {
    long pageno=os->pageno++;
    for(i=18;i<22;i++){
      os->header[i]=(unsigned char)(pageno&0xff);
      pageno>>=8;
    }
  }

  /* zero for computation; filled in later */
  os->header[22]=0;
  os->header[23]=0;
  os->header[24]=0;
  os->header[25]=0;

  /* segment table */
  os->header[26]=(unsigned char)(vals&0xff);
  for(i=0;i<vals;i++)
    bytes+=os->header[i+27]=(unsigned char)(os->lacing_vals[i]&0xff);

  /* set pointers in the ogg_page struct */
  og->header=os->header;
  og->header_len=os->header_fill=vals+27;
  og->body=os->body_data+os->body_returned;
  og->body_len=bytes;

  /* advance the lacing data and set the body_returned pointer */

  os->lacing_fill-=vals;
  memmove(os->lacing_vals,os->lacing_vals+vals,os->lacing_fill*sizeof(*os->lacing_vals));
  memmove(os->granule_vals,os->granule_vals+vals,os->lacing_fill*sizeof(*os->granule_vals));
  os->body_returned+=bytes;

  /* calculate the checksum */

  ogg_page_checksum_set(og);

  /* done */
  return(1);
}